

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O2

spv_result_t spvtools::val::MaximalReconvergenceChecks(ValidationState_t *_)

{
  uint32_t *puVar1;
  pointer pFVar2;
  pointer pIVar3;
  pointer ppBVar4;
  BasicBlock *pBVar5;
  pointer ppBVar6;
  uint uVar7;
  uint uVar8;
  set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_> *this;
  size_type sVar9;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *pvVar10;
  size_type sVar11;
  _Base_ptr p_Var12;
  vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_> *pvVar13;
  Instruction *inst;
  pair<const_spvtools::val::Instruction_*,_unsigned_int> *pair;
  pointer pFVar14;
  pointer ppVar15;
  spv_result_t sVar16;
  Function *func;
  uint32_t *puVar17;
  bool bVar18;
  pointer this_00;
  pointer ppBVar19;
  pointer ppBVar20;
  uint32_t local_2c4;
  Function *local_2c0;
  pointer local_2b8;
  uint id;
  undefined4 uStack_2ac;
  size_type local_2a8;
  __node_base local_2a0;
  ulong uStack_298;
  float local_290;
  size_t local_288;
  __node_base_ptr p_Stack_280;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  maximal_funcs;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  maximal_entry_points;
  uint entry_point;
  _Rb_tree_node_base local_200 [14];
  spv_result_t local_38;
  
  maximal_funcs._M_h._M_buckets = &maximal_funcs._M_h._M_single_bucket;
  maximal_funcs._M_h._M_bucket_count = 1;
  maximal_funcs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  maximal_funcs._M_h._M_element_count = 0;
  maximal_funcs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  maximal_funcs._M_h._M_rehash_policy._M_next_resize = 0;
  maximal_funcs._M_h._M_single_bucket = (__node_base_ptr)0x0;
  maximal_entry_points._M_h._M_buckets = &maximal_entry_points._M_h._M_single_bucket;
  maximal_entry_points._M_h._M_bucket_count = 1;
  maximal_entry_points._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  maximal_entry_points._M_h._M_element_count = 0;
  maximal_entry_points._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  maximal_entry_points._M_h._M_rehash_policy._M_next_resize = 0;
  maximal_entry_points._M_h._M_single_bucket = (__node_base_ptr)0x0;
  puVar1 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar17 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start; puVar17 != puVar1; puVar17 = puVar17 + 1)
  {
    entry_point = *puVar17;
    this = ValidationState_t::GetExecutionModes(_,entry_point);
    if (this != (set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
                 *)0x0) {
      _id = (__node_base_ptr *)CONCAT44(uStack_2ac,0x1787);
      sVar9 = std::
              set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>
              ::count(this,&id);
      if (sVar9 != 0) {
        std::__detail::
        _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&maximal_entry_points,&entry_point);
        std::__detail::
        _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&maximal_funcs,&entry_point);
      }
    }
  }
  sVar16 = SPV_SUCCESS;
  if (maximal_entry_points._M_h._M_element_count != 0) {
    pvVar10 = ValidationState_t::functions(_);
    pFVar2 = (pvVar10->
             super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (pFVar14 = (pvVar10->
                   super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
                   )._M_impl.super__Vector_impl_data._M_start; pFVar14 != pFVar2;
        pFVar14 = pFVar14 + 1) {
      ValidationState_t::EntryPointReferences
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &entry_point,_,pFVar14->id_);
      for (p_Var12 = local_200[0]._M_left; p_Var12 != local_200;
          p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
        _id = (__node_base_ptr *)CONCAT44(uStack_2ac,p_Var12[1]._M_color);
        sVar11 = std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::count(&maximal_entry_points._M_h,&id);
        if (sVar11 != 0) {
          local_2c4 = pFVar14->id_;
          std::__detail::
          _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
          ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                    *)&maximal_funcs,&local_2c4);
          break;
        }
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&entry_point);
    }
    pIVar3 = (_->ordered_instructions_).
             super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (_->ordered_instructions_).
                   super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pIVar3;
        this_00 = this_00 + 1) {
      if ((this_00->inst_).opcode == 0xfa) {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(this_00,1);
        uVar8 = Instruction::GetOperandAs<unsigned_int>(this_00,2);
        if (uVar7 == uVar8) {
          entry_point = this_00->function_->id_;
          sVar11 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::count(&maximal_funcs._M_h,&entry_point);
          if (sVar11 != 0) {
            ValidationState_t::diag((DiagnosticStream *)&entry_point,_,SPV_ERROR_INVALID_ID,this_00)
            ;
            std::operator<<((ostream *)&entry_point,
                            "In entry points using the MaximallyReconvergesKHR execution mode, True Label and False Label must be different labels"
                           );
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&entry_point);
            sVar16 = local_38;
            goto LAB_00194c87;
          }
        }
      }
    }
    pvVar10 = ValidationState_t::functions(_);
    local_2b8 = (pvVar10->
                super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    pFVar14 = (pvVar10->
              super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    while (pFVar14 != local_2b8) {
      entry_point = pFVar14->id_;
      local_2c0 = pFVar14;
      sVar11 = std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::count(&maximal_funcs._M_h,&entry_point);
      if (sVar11 != 0) {
        pvVar13 = Function::ordered_blocks(local_2c0);
        ppBVar4 = (pvVar13->
                  super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        for (ppBVar19 = (pvVar13->
                        super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                        )._M_impl.super__Vector_impl_data._M_start; ppBVar19 != ppBVar4;
            ppBVar19 = ppBVar19 + 1) {
          pBVar5 = *ppBVar19;
          _id = &p_Stack_280;
          local_2a8 = 1;
          local_2a0._M_nxt = (_Hash_node_base *)0x0;
          uStack_298 = 0;
          local_290 = 1.0;
          local_288 = 0;
          p_Stack_280 = (__node_base_ptr)0x0;
          ppBVar6 = (pBVar5->predecessors_).
                    super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (ppBVar20 = (pBVar5->predecessors_).
                          super__Vector_base<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppBVar20 != ppBVar6;
              ppBVar20 = ppBVar20 + 1) {
            entry_point = (*ppBVar20)->id_;
            std::__detail::
            _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
            ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                      *)&id,&entry_point);
          }
          if ((1 < uStack_298) && (pBVar5->terminator_[-1].inst_.opcode != 0xf6)) {
            inst = ValidationState_t::FindDef(_,pBVar5->id_);
            bVar18 = false;
            for (ppVar15 = (inst->uses_).
                           super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppVar15 !=
                (inst->uses_).
                super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar15 = ppVar15 + 1) {
              uVar7 = (ppVar15->first->inst_).opcode - 0xf6;
              if ((uVar7 < 6) && ((0x23U >> (uVar7 & 0x1f) & 1) != 0)) {
                bVar18 = true;
              }
            }
            if (!bVar18) {
              ValidationState_t::diag((DiagnosticStream *)&entry_point,_,SPV_ERROR_INVALID_CFG,inst)
              ;
              std::operator<<((ostream *)&entry_point,
                              "In entry points using the MaximallyReconvergesKHR execution mode, this basic block must not have multiple unique predecessors"
                             );
              DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&entry_point);
              std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)&id);
              sVar16 = local_38;
              goto LAB_00194c87;
            }
          }
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&id);
        }
      }
      pFVar14 = local_2c0 + 1;
    }
    sVar16 = SPV_SUCCESS;
  }
LAB_00194c87:
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&maximal_entry_points._M_h);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&maximal_funcs._M_h);
  return sVar16;
}

Assistant:

spv_result_t StructuredSwitchChecks(ValidationState_t& _, Function* function,
                                    const Instruction* switch_inst,
                                    const BasicBlock* header,
                                    const BasicBlock* merge) {
  std::unordered_set<uint32_t> case_targets;
  for (uint32_t i = 1; i < switch_inst->operands().size(); i += 2) {
    uint32_t target = switch_inst->GetOperandAs<uint32_t>(i);
    if (target != merge->id()) case_targets.insert(target);
  }
  // Tracks how many times each case construct is targeted by another case
  // construct.
  std::map<uint32_t, uint32_t> num_fall_through_targeted;
  uint32_t default_case_fall_through = 0u;
  uint32_t default_target = switch_inst->GetOperandAs<uint32_t>(1u);
  bool default_appears_multiple_times = false;
  for (uint32_t i = 3; i < switch_inst->operands().size(); i += 2) {
    if (default_target == switch_inst->GetOperandAs<uint32_t>(i)) {
      default_appears_multiple_times = true;
      break;
    }
  }
  std::unordered_map<uint32_t, uint32_t> seen_to_fall_through;
  for (uint32_t i = 1; i < switch_inst->operands().size(); i += 2) {
    uint32_t target = switch_inst->GetOperandAs<uint32_t>(i);
    if (target == merge->id()) continue;

    uint32_t case_fall_through = 0u;
    auto seen_iter = seen_to_fall_through.find(target);
    if (seen_iter == seen_to_fall_through.end()) {
      const auto target_block = function->GetBlock(target).first;
      // OpSwitch must dominate all its case constructs.
      if (header->structurally_reachable() &&
          target_block->structurally_reachable() &&
          !header->structurally_dominates(*target_block)) {
        return _.diag(SPV_ERROR_INVALID_CFG, header->label())
               << "Switch header " << _.getIdName(header->id())
               << " does not structurally dominate its case construct "
               << _.getIdName(target);
      }

      if (auto error = FindCaseFallThrough(_, target_block, &case_fall_through,
                                           merge, case_targets, function)) {
        return error;
      }

      // Track how many time the fall through case has been targeted.
      if (case_fall_through != 0u) {
        auto where = num_fall_through_targeted.lower_bound(case_fall_through);
        if (where == num_fall_through_targeted.end() ||
            where->first != case_fall_through) {
          num_fall_through_targeted.insert(
              where, std::make_pair(case_fall_through, 1));
        } else {
          where->second++;
        }
      }
      seen_to_fall_through.insert(std::make_pair(target, case_fall_through));
    } else {
      case_fall_through = seen_iter->second;
    }

    if (case_fall_through == default_target &&
        !default_appears_multiple_times) {
      case_fall_through = default_case_fall_through;
    }
    if (case_fall_through != 0u) {
      bool is_default = i == 1;
      if (is_default) {
        default_case_fall_through = case_fall_through;
      } else {
        // Allow code like:
        // case x:
        // case y:
        //   ...
        // case z:
        //
        // Where x and y target the same block and fall through to z.
        uint32_t j = i;
        while ((j + 2 < switch_inst->operands().size()) &&
               target == switch_inst->GetOperandAs<uint32_t>(j + 2)) {
          j += 2;
        }
        // If Target T1 branches to Target T2, or if Target T1 branches to the
        // Default target and the Default target branches to Target T2, then T1
        // must immediately precede T2 in the list of OpSwitch Target operands.
        if ((switch_inst->operands().size() < j + 2) ||
            (case_fall_through != switch_inst->GetOperandAs<uint32_t>(j + 2))) {
          return _.diag(SPV_ERROR_INVALID_CFG, switch_inst)
                 << "Case construct that targets " << _.getIdName(target)
                 << " has branches to the case construct that targets "
                 << _.getIdName(case_fall_through)
                 << ", but does not immediately precede it in the "
                    "OpSwitch's target list";
        }
      }
    }
  }

  // Each case construct must be branched to by at most one other case
  // construct.
  for (const auto& pair : num_fall_through_targeted) {
    if (pair.second > 1) {
      return _.diag(SPV_ERROR_INVALID_CFG, _.FindDef(pair.first))
             << "Multiple case constructs have branches to the case construct "
                "that targets "
             << _.getIdName(pair.first);
    }
  }

  return SPV_SUCCESS;
}